

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O0

void __thiscall gutil::Parameter::nextString(Parameter *this,string *s,char *opt)

{
  size_type __n;
  pointer pbVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  reference pvVar4;
  undefined8 uVar5;
  char *in_RDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  allocator *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  pointer message;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 uVar7;
  allocator in_stack_fffffffffffffea7;
  char *in_stack_fffffffffffffea8;
  string local_d0 [32];
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  char *local_18;
  string *local_10;
  
  message = *(pointer *)(in_RDI + 0x88);
  local_18 = in_RDX;
  local_10 = in_RSI;
  pbVar1 = (pointer)std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_RDI);
  if (pbVar1 <= message) {
    uVar7 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    paVar6 = (allocator *)&stack0xfffffffffffffea7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffea8,"There are no more values!",paVar6);
    IOException::IOException
              ((IOException *)
               CONCAT17(in_stack_fffffffffffffea7,CONCAT16(uVar7,in_stack_fffffffffffffea0)),message
              );
    __cxa_throw(uVar5,&IOException::typeinfo,IOException::~IOException);
  }
  if (local_18 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,local_18,&local_79);
    std::operator+((char)((ulong)in_stack_fffffffffffffe68 >> 0x38),in_stack_fffffffffffffe60);
    std::operator+(in_stack_fffffffffffffe68,(char)((ulong)in_stack_fffffffffffffe60 >> 0x38));
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI,(size_type)*(pointer *)(in_RDI + 0x88));
    std::operator+((char)((ulong)message >> 0x38),in_RDI);
    std::operator+(in_stack_fffffffffffffe68,(char)((ulong)in_stack_fffffffffffffe60 >> 0x38));
    uVar2 = std::__cxx11::string::find(local_38,(ulong)local_b0);
    uVar3 = std::__cxx11::string::size();
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    if (uVar3 <= uVar2) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI,*(size_type *)(in_RDI + 0x88));
      std::operator+(in_stack_fffffffffffffea8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffea7,
                              CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)));
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
      std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
      IOException::IOException
                ((IOException *)
                 CONCAT17(in_stack_fffffffffffffea7,
                          CONCAT16(in_stack_fffffffffffffea6,in_stack_fffffffffffffea0)),message);
      __cxa_throw(__lhs,&IOException::typeinfo,IOException::~IOException);
    }
    std::__cxx11::string::~string(local_38);
  }
  __n = *(size_type *)(in_RDI + 0x88);
  *(size_type *)(in_RDI + 0x88) = __n + 1;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_RDI,__n);
  std::__cxx11::string::operator=(local_10,(string *)pvVar4);
  return;
}

Assistant:

void Parameter::nextString(std::string &s, const char *opt)
{
  if (pos < list.size())
  {
    if (opt != 0)
    {
      std::string p='|'+std::string(opt)+'|';

      if (p.find('|'+list[pos]+'|') >= p.size())
      {
        throw IOException("Argument '"+list[pos]+"' must be one of: "+opt);
      }
    }

    s=list[pos++];
  }
  else
  {
    throw IOException("There are no more values!");
  }
}